

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.hpp
# Opt level: O0

void __thiscall InstructionSet::x86::Flags::set(Flags *this,uint16_t value)

{
  uint16_t value_local;
  Flags *this_local;
  
  set_from<(InstructionSet::x86::Flag)0>(this,value & 1);
  set_from<(InstructionSet::x86::Flag)1>(this,value & 0x10);
  set_from<(InstructionSet::x86::Flag)3>(this,value & 0x800);
  set_from<(InstructionSet::x86::Flag)4>(this,value & 0x100);
  set_from<(InstructionSet::x86::Flag)5>(this,value & 0x200);
  set_from<(InstructionSet::x86::Flag)6>(this,value & 0x400);
  set_from<unsigned_char,(InstructionSet::x86::Flag)2>(this,(uchar)value);
  set_from<(InstructionSet::x86::Flag)7>(this,(value ^ 0xffffffff) & 0x40);
  set_from<(InstructionSet::x86::Flag)8>(this,(value ^ 0xffffffff) & 4);
  return;
}

Assistant:

void set(uint16_t value) {
			set_from<Flag::Carry>(value & FlagValue::Carry);
			set_from<Flag::AuxiliaryCarry>(value & FlagValue::AuxiliaryCarry);
			set_from<Flag::Overflow>(value & FlagValue::Overflow);
			set_from<Flag::Trap>(value & FlagValue::Trap);
			set_from<Flag::Interrupt>(value & FlagValue::Interrupt);
			set_from<Flag::Direction>(value & FlagValue::Direction);

			set_from<uint8_t, Flag::Sign>(uint8_t(value));

			set_from<Flag::Zero>((~value) & FlagValue::Zero);
			set_from<Flag::ParityOdd>((~value) & FlagValue::Parity);
		}